

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Guild.cpp
# Opt level: O2

void Handlers::Guild_Report(Character *character,PacketReader *reader)

{
  World *pWVar1;
  GuildManager *pGVar2;
  __shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Alloc_hider __s;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  mapped_type *pmVar8;
  tm *__tp;
  int subject;
  char *__rhs;
  __shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2> *p_Var9;
  string *this;
  _List_node_base *p_Var10;
  long lVar11;
  PacketBuilder reply;
  shared_ptr<Guild> guild;
  string create_date;
  string rank;
  list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_> leaders;
  shared_ptr<Guild_Member> member_2;
  string bank_str;
  list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_> recruiters;
  string tag;
  string local_70 [32];
  string local_50 [32];
  
  PacketReader::GetInt(reader);
  PacketReader::GetEndString_abi_cxx11_(&tag,reader);
  sVar4 = tag._M_string_length;
  pWVar1 = character->world;
  std::__cxx11::string::string((string *)&reply,"GuildMaxNameLength",(allocator *)&create_date);
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&pWVar1->config,(key_type *)&reply);
  iVar6 = util::variant::GetInt(pmVar8);
  std::__cxx11::string::~string((string *)&reply);
  if ((sVar4 <= (ulong)(long)iVar6) && (character->npc_type == Guild)) {
    guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((tag._M_string_length & 0xfffffffffffffffe) == 2) {
      pGVar2 = character->world->guildmanager;
      std::__cxx11::string::string(local_50,(string *)&tag);
      GuildManager::GetGuild((GuildManager *)&reply,(string *)pGVar2);
      std::__shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2> *)&reply);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&reply.data);
      this = local_50;
    }
    else {
      pGVar2 = character->world->guildmanager;
      std::__cxx11::string::string(local_70,(string *)&tag);
      GuildManager::GetGuildName((GuildManager *)&reply,(string *)pGVar2);
      std::__shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2> *)&reply);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&reply.data);
      this = local_70;
    }
    std::__cxx11::string::~string(this);
    if (guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
      PacketBuilder::PacketBuilder(&reply,PACKET_GUILD,PACKET_REPLY,2);
      PacketBuilder::AddShort(&reply,0x11);
      Character::Send(character,&reply);
      PacketBuilder::~PacketBuilder(&reply);
    }
    else {
      pWVar1 = character->world;
      std::__cxx11::string::string((string *)&reply,"GuildEditRank",(allocator *)&bank_str);
      pmVar8 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,(key_type *)&reply);
      iVar7 = util::variant::GetInt(pmVar8);
      pWVar1 = character->world;
      std::__cxx11::string::string((string *)&create_date,"GuildKickRank",(allocator *)&rank);
      pmVar8 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,&create_date);
      iVar6 = util::variant::GetInt(pmVar8);
      if (iVar6 < iVar7) {
        iVar6 = iVar7;
      }
      std::__cxx11::string::~string((string *)&create_date);
      std::__cxx11::string::~string((string *)&reply);
      pWVar1 = character->world;
      std::__cxx11::string::string((string *)&reply,"GuildRecruitRank",(allocator *)&create_date);
      pmVar8 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,(key_type *)&reply);
      iVar7 = util::variant::GetInt(pmVar8);
      std::__cxx11::string::~string((string *)&reply);
      leaders.
      super__List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&leaders;
      leaders.
      super__List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
      ._M_impl._M_node._M_size = 0;
      recruiters.
      super__List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&recruiters;
      recruiters.
      super__List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
      ._M_impl._M_node._M_size = 0;
      p_Var3 = &(((guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->members).
                 super__Vector_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->
                super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>;
      leaders.
      super__List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev =
           leaders.
           super__List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
      recruiters.
      super__List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev =
           recruiters.
           super__List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
      for (p_Var9 = &(((guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->members
                      ).
                      super__Vector_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                     super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>; p_Var9 != p_Var3;
          p_Var9 = p_Var9 + 1) {
        std::__shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2> *)&reply,p_Var9);
        if (*(int *)(reply._0_8_ + 0x20) <= iVar6) {
          std::__cxx11::
          list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>::
          push_back(&leaders,(value_type *)&reply);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&reply.data);
      }
      pWVar1 = character->world;
      std::__cxx11::string::string((string *)&reply,"GuildShowRecruiters",(allocator *)&create_date)
      ;
      pmVar8 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,(key_type *)&reply);
      bVar5 = util::variant::GetBool(pmVar8);
      std::__cxx11::string::~string((string *)&reply);
      if (bVar5) {
        p_Var3 = &(((guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->members).
                   super__Vector_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->
                  super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>;
        for (p_Var9 = &(((guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        members).
                        super__Vector_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>;
            p_Var9 != p_Var3; p_Var9 = p_Var9 + 1) {
          std::__shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2> *)&reply,p_Var9);
          if ((iVar6 < *(int *)(reply._0_8_ + 0x20)) && (*(int *)(reply._0_8_ + 0x20) <= iVar7)) {
            std::__cxx11::
            list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>::
            push_back(&recruiters,(value_type *)&reply);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&reply.data);
        }
      }
      create_date._M_dataplus._M_p = (pointer)&create_date.field_2;
      create_date._M_string_length = 0;
      create_date.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::resize((ulong)&create_date);
      __tp = localtime(&(guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        created);
      __s = create_date._M_dataplus;
      pWVar1 = character->world;
      std::__cxx11::string::string((string *)&rank,"GuildDateFormat",(allocator *)&member_2);
      pmVar8 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,&rank);
      util::variant::GetString_abi_cxx11_(&bank_str,pmVar8);
      strftime(__s._M_p,0x1f,bank_str._M_dataplus._M_p,__tp);
      std::__cxx11::string::substr((ulong)&reply,(ulong)&create_date);
      std::__cxx11::string::operator=((string *)&create_date,(string *)&reply);
      std::__cxx11::string::~string((string *)&reply);
      std::__cxx11::string::~string((string *)&bank_str);
      std::__cxx11::string::~string((string *)&rank);
      util::to_string_abi_cxx11_
                (&bank_str,
                 (util *)(ulong)(uint)(guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr)->bank,subject);
      PacketBuilder::PacketBuilder
                (&reply,PACKET_GUILD,PACKET_REPORT,
                 ((guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name).
                 _M_string_length + create_date._M_string_length +
                 ((guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->description)
                 ._M_string_length + bank_str._M_string_length +
                 (recruiters.
                  super__List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                  ._M_impl._M_node._M_size +
                 leaders.
                 super__List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                 ._M_impl._M_node._M_size) * 0xf + 0x15);
      PacketBuilder::AddBreakString
                (&reply,&(guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name,
                 0xff);
      PacketBuilder::AddBreakString
                (&reply,&(guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tag,
                 0xff);
      PacketBuilder::AddBreakString(&reply,&create_date,0xff);
      PacketBuilder::AddBreakString
                (&reply,&(guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         description,0xff);
      PacketBuilder::AddBreakString(&reply,&bank_str,0xff);
      for (lVar11 = 0; lVar11 != 9; lVar11 = lVar11 + 1) {
        std::__cxx11::string::string
                  ((string *)&rank,
                   (string *)
                   (((guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ranks).
                    _M_elems + lVar11));
        while (rank._M_string_length < 4) {
          std::__cxx11::string::push_back((char)&rank);
        }
        PacketBuilder::AddBreakString(&reply,&rank,0xff);
        std::__cxx11::string::~string((string *)&rank);
      }
      PacketBuilder::AddShort
                (&reply,(short)recruiters.
                               super__List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                               ._M_impl._M_node._M_size +
                        (short)leaders.
                               super__List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                               ._M_impl._M_node._M_size);
      PacketBuilder::AddByte(&reply,0xff);
      p_Var10 = (_List_node_base *)&leaders;
      while (p_Var10 = (((_List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                          *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var10 != (_List_node_base *)&leaders) {
        std::__shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&member_2.super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2> *)(p_Var10 + 1));
        PacketBuilder::AddChar(&reply,'\x01');
        PacketBuilder::AddByte(&reply,0xff);
        __rhs = "";
        if ((member_2.super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->rank ==
            0) {
          __rhs = " (founder)";
        }
        std::operator+(&rank,&(member_2.super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->name,__rhs);
        PacketBuilder::AddBreakString(&reply,&rank,0xff);
        std::__cxx11::string::~string((string *)&rank);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&member_2.super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      p_Var10 = (_List_node_base *)&recruiters;
      while (p_Var10 = (((_List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                          *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var10 != (_List_node_base *)&recruiters) {
        std::__shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2> *)&rank,
                   (__shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2> *)(p_Var10 + 1));
        PacketBuilder::AddChar(&reply,'\x02');
        PacketBuilder::AddByte(&reply,0xff);
        PacketBuilder::AddBreakString(&reply,(string *)rank._M_dataplus._M_p,0xff);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&rank._M_string_length);
      }
      Character::Send(character,&reply);
      PacketBuilder::~PacketBuilder(&reply);
      std::__cxx11::string::~string((string *)&bank_str);
      std::__cxx11::string::~string((string *)&create_date);
      std::__cxx11::
      _List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>::
      _M_clear(&recruiters.
                super__List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
              );
      std::__cxx11::
      _List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>::
      _M_clear(&leaders.
                super__List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
              );
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__cxx11::string::~string((string *)&tag);
  return;
}

Assistant:

void Guild_Report(Character *character, PacketReader &reader)
{
	/*int session =*/ reader.GetInt();
	std::string tag = reader.GetEndString();

	if (tag.length() > std::size_t(int(character->world->config["GuildMaxNameLength"])))
	{
		return;
	}

	if (character->npc_type == ENF::Guild)
	{
		std::shared_ptr<Guild> guild;

		if (tag.length() == 2 || tag.length() == 3)
		{
			guild = character->world->guildmanager->GetGuild(tag);
		}
		else
		{
			guild = character->world->guildmanager->GetGuildName(tag);
		}

		if (!guild)
		{
			PacketBuilder reply(PACKET_GUILD, PACKET_REPLY, 2);
			reply.AddShort(GUILD_NOT_FOUND);
			character->Send(reply);
		}
		else
		{
			int leader_rank = std::max(static_cast<int>(character->world->config["GuildEditRank"]), static_cast<int>(character->world->config["GuildKickRank"]));
			int recruiter_rank = character->world->config["GuildRecruitRank"];

			std::list<std::shared_ptr<Guild_Member>> leaders;
			std::list<std::shared_ptr<Guild_Member>> recruiters;

			UTIL_FOREACH(guild->members, member)
			{
				if (member->rank <= leader_rank)
				{
					leaders.push_back(member);
				}
			}

			if (character->world->config["GuildShowRecruiters"])
			{
				UTIL_FOREACH(guild->members, member)
				{
					if (member->rank > leader_rank && member->rank <= recruiter_rank)
					{
						recruiters.push_back(member);
					}
				}
			}

			std::string create_date;
			create_date.resize(31);

			tm *local_time = localtime(&guild->created);
			create_date = create_date.substr(0, strftime(&create_date[0], 31, static_cast<std::string>(character->world->config["GuildDateFormat"]).c_str(), local_time));

			std::string bank_str = util::to_string(guild->bank);

			PacketBuilder reply(PACKET_GUILD, PACKET_REPORT,
				21 + guild->name.length() + create_date.length() + guild->description.length() + bank_str.length()
				+ leaders.size() * 15 + recruiters.size() * 15);

			reply.AddBreakString(guild->name);
			reply.AddBreakString(guild->tag);
			reply.AddBreakString(create_date);
			reply.AddBreakString(guild->description);
			reply.AddBreakString(bank_str);

			for (std::size_t i = 0; i < guild->ranks.size(); ++i)
			{
				std::string rank = guild->ranks[i];

				while (rank.length() < 4)
				{
					rank += ' ';
				}

				reply.AddBreakString(rank);
			}

			reply.AddShort(leaders.size() + recruiters.size());
			reply.AddByte(255);

			UTIL_FOREACH(leaders, member)
			{
				reply.AddChar(1);
				reply.AddByte(255);
				reply.AddBreakString(member->name + (member->rank == 0 ? " (founder)" : ""));
			}

			UTIL_FOREACH(recruiters, member)
			{
				reply.AddChar(2);
				reply.AddByte(255);
				reply.AddBreakString(member->name);
			}

			character->Send(reply);
		}
	}
}